

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImVector_float *pIVar2;
  ImGuiWindow_conflict *pIVar3;
  float *pfVar4;
  ImGuiContext_conflict1 *pIVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ImGuiContext_conflict1 *ctx;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_50;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar11 = (GImGui->Style).ItemInnerSpacing.x;
  fVar12 = (float)(int)((w_full - fVar11 * (float)(components + -1)) / (float)components);
  local_50 = 1.0;
  fVar13 = 1.0;
  if (1.0 <= fVar12) {
    fVar13 = fVar12;
  }
  fVar11 = (float)(int)(w_full - (fVar11 + fVar13) * (float)(components + -1));
  iVar9 = (pIVar3->DC).ItemWidthStack.Size;
  iVar10 = (pIVar3->DC).ItemWidthStack.Capacity;
  if (iVar9 == iVar10) {
    iVar9 = iVar9 + 1;
    if (iVar10 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar10 / 2 + iVar10;
    }
    if (iVar9 < iVar7) {
      iVar9 = iVar7;
    }
    if (iVar10 < iVar9) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar6,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
      }
      (pIVar3->DC).ItemWidthStack.Data = pfVar6;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar9;
    }
  }
  if (1.0 <= fVar11) {
    local_50 = fVar11;
  }
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = (pIVar3->DC).ItemWidth;
  iVar10 = (pIVar3->DC).ItemWidthStack.Size;
  iVar7 = (pIVar3->DC).ItemWidthStack.Capacity;
  iVar9 = iVar10 + 1;
  (pIVar3->DC).ItemWidthStack.Size = iVar9;
  if (iVar9 == iVar7) {
    iVar10 = iVar10 + 2;
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar7 < iVar10) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar6,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
      }
      (pIVar3->DC).ItemWidthStack.Data = pfVar6;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
    }
  }
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = local_50;
  pIVar2 = &(pIVar3->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if (2 < components) {
    iVar9 = components + -2;
    do {
      iVar10 = (pIVar3->DC).ItemWidthStack.Size;
      iVar7 = (pIVar3->DC).ItemWidthStack.Capacity;
      if (iVar10 == iVar7) {
        if (iVar7 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar7 / 2 + iVar7;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar7 < iVar10) {
          if (GImGui != (ImGuiContext_conflict1 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if (pfVar4 != (float *)0x0) {
            memcpy(pfVar6,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
            pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
            if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
          }
          (pIVar3->DC).ItemWidthStack.Data = pfVar6;
          (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
        }
      }
      (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = fVar13;
      pIVar2 = &(pIVar3->DC).ItemWidthStack;
      pIVar2->Size = pIVar2->Size + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  if (components != 1) {
    local_50 = fVar13;
  }
  (pIVar3->DC).ItemWidth = local_50;
  *(byte *)&(pIVar5->NextItemData).Flags = (byte)(pIVar5->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}